

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Exa_ManMarkup(Exa_Man_t_conflict *p)

{
  Vec_Wec_t *pVVar1;
  int Level;
  int iVar2;
  int local_2c;
  int local_1c;
  int local_18;
  int j;
  int k;
  int i;
  Exa_Man_t_conflict *p_local;
  
  if (0x20 < p->nObjs) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x22e,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  p->iVar = p->nNodes * 3 + 1;
  for (j = p->nVars; j < p->nObjs; j = j + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      if (((p->pPars->fFewerVars == 0) || (j != p->nObjs + -1)) || (local_18 != 0)) {
        if (p->pPars->fFewerVars == 0) {
          local_2c = 0;
        }
        else {
          local_2c = 1 - local_18;
        }
        for (local_1c = local_2c; local_1c < j - local_18; local_1c = local_1c + 1) {
          pVVar1 = p->vOutLits;
          iVar2 = Abc_Var2Lit(p->iVar,0);
          Vec_WecPush(pVVar1,local_1c,iVar2);
          iVar2 = p->iVar;
          p->iVar = iVar2 + 1;
          p->VarMarks[j][local_18][local_1c] = iVar2;
        }
      }
      else {
        Level = p->nObjs + -2;
        pVVar1 = p->vOutLits;
        iVar2 = Abc_Var2Lit(p->iVar,0);
        Vec_WecPush(pVVar1,Level,iVar2);
        iVar2 = p->iVar;
        p->iVar = iVar2 + 1;
        p->VarMarks[j][0][Level] = iVar2;
      }
    }
  }
  printf("The number of parameter variables = %d.\n",(ulong)(uint)p->iVar);
  return p->iVar;
}

Assistant:

int Exa_ManMarkup( Exa_Man_t * p )
{
    int i, k, j;
    assert( p->nObjs <= MAJ_NOBJS );
    // assign functionality
    p->iVar = 1 + p->nNodes * 3;
    // assign connectivity variables
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 2; k++ )
        {
            if ( p->pPars->fFewerVars && i == p->nObjs - 1 && k == 0 )
            {
                j = p->nObjs - 2;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = p->pPars->fFewerVars ? 1 - k : 0; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 2; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}